

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O3

void __thiscall
ear::PolarExtentCoreSimd<xsimd::sse2>::run
          (PolarExtentCoreSimd<xsimd::sse2> *this,PolarExtentCoreContext *ctx)

{
  size_t sVar1;
  size_t sVar2;
  extent_float_t *peVar3;
  extent_float_t *peVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 uVar7;
  int iVar8;
  float *pfVar9;
  ulong uVar10;
  ulong uVar11;
  float *pfVar12;
  long lVar13;
  size_t sVar14;
  long lVar15;
  ulong uVar16;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float fVar19;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float fVar20;
  batch bVar21;
  PositionBatch<xsimd::batch<float,_xsimd::sse2>_> pos;
  PositionBatch<xsimd::batch<float,_xsimd::sse2>_> local_58;
  float fVar17;
  float fVar18;
  
  if (ctx->num_speakers != 0) {
    memset(ctx->results,0,ctx->num_speakers << 2);
  }
  if (ctx->num_points != 0) {
    lVar15 = 0;
    uVar16 = 0;
    do {
      pfVar9 = ctx->xs + uVar16;
      if (((ulong)pfVar9 & 0xf) != 0) {
LAB_0014d02d:
        __assert_fail("((reinterpret_cast<uintptr_t>(mem) % A::alignment()) == 0) && \"loaded pointer is not properly aligned\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/xsimd/include/xsimd/types/xsimd_batch.hpp"
                      ,0x268,
                      "static batch<T, A> xsimd::batch<float>::load_aligned(const U *) [T = float, A = xsimd::sse2, U = float]"
                     );
      }
      local_58.x.super_simd_register<float,_xsimd::sse2>.data[0] = *pfVar9;
      local_58.x.super_simd_register<float,_xsimd::sse2>.data[1] = pfVar9[1];
      local_58.x.super_simd_register<float,_xsimd::sse2>.data[2] = pfVar9[2];
      local_58.x.super_simd_register<float,_xsimd::sse2>.data[3] = pfVar9[3];
      pfVar9 = ctx->ys + uVar16;
      if (((ulong)pfVar9 & 0xf) != 0) goto LAB_0014d02d;
      local_58.y.super_simd_register<float,_xsimd::sse2>.data[0] = *pfVar9;
      local_58.y.super_simd_register<float,_xsimd::sse2>.data[1] = pfVar9[1];
      local_58.y.super_simd_register<float,_xsimd::sse2>.data[2] = pfVar9[2];
      local_58.y.super_simd_register<float,_xsimd::sse2>.data[3] = pfVar9[3];
      pfVar9 = ctx->zs + uVar16;
      if (((ulong)pfVar9 & 0xf) != 0) goto LAB_0014d02d;
      local_58.z.super_simd_register<float,_xsimd::sse2>.data[0] = *pfVar9;
      local_58.z.super_simd_register<float,_xsimd::sse2>.data[1] = pfVar9[1];
      local_58.z.super_simd_register<float,_xsimd::sse2>.data[2] = pfVar9[2];
      local_58.z.super_simd_register<float,_xsimd::sse2>.data[3] = pfVar9[3];
      if (ctx->is_circular == true) {
        bVar21.super_simd_register<float,_xsimd::sse2>.data[2] =
             local_58.y.super_simd_register<float,_xsimd::sse2>.data[0] * ctx->flippedBasis[4] +
             local_58.z.super_simd_register<float,_xsimd::sse2>.data[0] * ctx->flippedBasis[5];
        bVar21.super_simd_register<float,_xsimd::sse2>.data[3] =
             local_58.y.super_simd_register<float,_xsimd::sse2>.data[1] * ctx->flippedBasis[4] +
             local_58.z.super_simd_register<float,_xsimd::sse2>.data[1] * ctx->flippedBasis[5];
        bVar21.super_simd_register<float,_xsimd::sse2>.data[0] =
             local_58.x.super_simd_register<float,_xsimd::sse2>.data[0] * ctx->flippedBasis[3] +
             bVar21.super_simd_register<float,_xsimd::sse2>.data[2];
        bVar21.super_simd_register<float,_xsimd::sse2>.data[1] =
             local_58.x.super_simd_register<float,_xsimd::sse2>.data[1] * ctx->flippedBasis[3] +
             bVar21.super_simd_register<float,_xsimd::sse2>.data[3];
        bVar21 = weight_from_cos(this,ctx,bVar21);
        fVar17 = bVar21.super_simd_register<float,_xsimd::sse2>.data[0];
        fVar18 = bVar21.super_simd_register<float,_xsimd::sse2>.data[1];
        fVar19 = extraout_XMM0_Dc;
        fVar20 = extraout_XMM0_Dd;
        uVar7 = extraout_EAX;
      }
      else {
        bVar21 = weight_stadium(this,ctx,&local_58);
        fVar17 = bVar21.super_simd_register<float,_xsimd::sse2>.data[0];
        fVar18 = bVar21.super_simd_register<float,_xsimd::sse2>.data[1];
        fVar19 = extraout_XMM0_Dc_00;
        fVar20 = extraout_XMM0_Dd_00;
        uVar7 = extraout_EAX_00;
      }
      auVar5._4_4_ = -(uint)(fVar18 != 1.0);
      auVar5._0_4_ = -(uint)(fVar17 != 1.0);
      auVar5._8_4_ = -(uint)(fVar19 != 1.0);
      auVar5._12_4_ = -(uint)(fVar20 != 1.0);
      iVar8 = movmskps(uVar7,auVar5);
      if (iVar8 == 0) {
        uVar11 = ctx->num_speakers;
        if (uVar11 != 0) {
          uVar10 = 0;
          do {
            pfVar9 = ctx->summed_panning_results + uVar11 * (uVar16 >> 2) + uVar10;
            if ((((ulong)pfVar9 & 0xf) != 0) ||
               (pfVar12 = ctx->results + uVar10, ((ulong)pfVar12 & 0xf) != 0)) goto LAB_0014d02d;
            fVar19 = pfVar9[1];
            fVar20 = pfVar9[2];
            fVar17 = pfVar9[3];
            *pfVar12 = *pfVar9 + *pfVar12;
            pfVar12[1] = fVar19 + pfVar12[1];
            pfVar12[2] = fVar20 + pfVar12[2];
            pfVar12[3] = fVar17 + pfVar12[3];
            uVar10 = uVar10 + 4;
            uVar11 = ctx->num_speakers;
          } while (uVar10 < uVar11);
        }
      }
      else {
        auVar6._4_4_ = -(uint)(fVar18 != 0.0);
        auVar6._0_4_ = -(uint)(fVar17 != 0.0);
        auVar6._8_4_ = -(uint)(fVar19 != 0.0);
        auVar6._12_4_ = -(uint)(fVar20 != 0.0);
        iVar8 = movmskps(iVar8,auVar6);
        if ((iVar8 != 0) && (sVar1 = ctx->real_num_speakers, sVar1 != 0)) {
          sVar2 = ctx->num_points;
          peVar3 = ctx->panning_results;
          peVar4 = ctx->results;
          sVar14 = 0;
          lVar13 = lVar15;
          do {
            if (((int)peVar3 + (int)lVar13 & 0xfU) != 0) goto LAB_0014d02d;
            pfVar9 = (float *)((long)peVar3 + lVar13);
            peVar4[sVar14] =
                 pfVar9[3] * fVar20 + pfVar9[1] * fVar18 + pfVar9[2] * fVar19 + *pfVar9 * fVar17 +
                 peVar4[sVar14];
            sVar14 = sVar14 + 1;
            lVar13 = lVar13 + sVar2 * 4;
          } while (sVar1 != sVar14);
        }
      }
      uVar16 = uVar16 + 4;
      lVar15 = lVar15 + 0x10;
    } while (uVar16 < ctx->num_points);
  }
  return;
}

Assistant:

void run(PolarExtentCoreContext &ctx) const override {
      for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
           speaker_idx++)
        ctx.results[speaker_idx] = 0.0;

      for (size_t i = 0; i < ctx.num_points; i += batch::size) {
        PositionBatch<batch> pos;
        pos.x = batch::load_aligned(ctx.xs + i);
        pos.y = batch::load_aligned(ctx.ys + i);
        pos.z = batch::load_aligned(ctx.zs + i);

        batch weight = ctx.is_circular ? weight_circle(ctx, pos)
                                       : weight_stadium(ctx, pos);

        bool all_zeros = xsimd::all(weight == 0.0);
        bool all_ones = xsimd::all(weight == 1.0);
        if (all_ones) {
          // add pre-computed sum for this batch
          size_t batch_i = i / batch::size;
          for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
               speaker_idx += batch::size) {
            batch gain =
                batch::load_aligned(ctx.summed_panning_results +
                                    (batch_i * ctx.num_speakers) + speaker_idx);

            extent_float_t *result_ptr = ctx.results + speaker_idx;
            xsimd::store_aligned(result_ptr,
                                 batch::load_aligned(result_ptr) + gain);
          }
        } else if (!all_zeros) {
          for (size_t speaker_idx = 0; speaker_idx < ctx.real_num_speakers;
               speaker_idx++) {
            batch gain = batch::load_aligned(ctx.panning_results +
                                             speaker_idx * ctx.num_points + i);
            ctx.results[speaker_idx] += xsimd::reduce_add(gain * weight);
          }
        }
      }
    }